

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_projection2.c
# Opt level: O2

int main(int argc,char **argv)

{
  double dVar1;
  bool bVar2;
  bool bVar3;
  ALLEGRO_BITMAP *pAVar4;
  bool bVar5;
  char cVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  ALLEGRO_BITMAP *pAVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  long lVar14;
  char *pcVar15;
  bool bVar16;
  bool bVar17;
  float fVar18;
  float fVar19;
  float in_XMM3_Da;
  undefined1 auStack_100 [64];
  code *pcStack_c0;
  float local_b8;
  uint local_b4;
  undefined8 local_b0;
  long local_a8;
  ALLEGRO_BITMAP *local_a0;
  undefined8 local_98;
  ALLEGRO_BITMAP *local_90;
  undefined8 local_88;
  ALLEGRO_BITMAP *local_80;
  ALLEGRO_EVENT event;
  
  if (1 < argc) {
    pcVar15 = argv[1];
    pcStack_c0 = (code *)0x1025d9;
    iVar7 = strcmp(pcVar15,"--use-shaders");
    lVar14 = 0x810;
    if (iVar7 == 0) goto LAB_001025f6;
    pcStack_c0 = (code *)0x1025f3;
    abort_example("Unknown command line argument: %s\n",pcVar15);
  }
  lVar14 = 0x10;
LAB_001025f6:
  pcStack_c0 = (code *)0x102607;
  cVar6 = al_install_system(0x5020700,atexit);
  if (cVar6 == '\0') {
    pcVar15 = "Could not init Allegro.\n";
  }
  else {
    pcStack_c0 = (code *)0x102614;
    al_init_image_addon();
    pcStack_c0 = (code *)0x102619;
    al_init_primitives_addon();
    pcStack_c0 = (code *)0x10261e;
    al_init_font_addon();
    pcStack_c0 = (code *)0x102623;
    al_install_keyboard();
    pcStack_c0 = (code *)0x10262a;
    al_set_new_display_flags(lVar14);
    pcStack_c0 = (code *)0x102638;
    al_set_new_display_option(0xf,0x10,2);
    pcStack_c0 = (code *)0x102645;
    al_set_new_display_option(0x1c,0,1);
    pcStack_c0 = (code *)0x102654;
    lVar9 = al_create_display(800,600);
    if (lVar9 == 0) {
      pcVar15 = "Error creating display\n";
    }
    else {
      pcStack_c0 = (code *)0x102677;
      al_set_window_constraints(lVar9,0x100,0x200,0,0);
      pcStack_c0 = (code *)0x102682;
      al_apply_window_constraints(lVar9,1);
      pcStack_c0 = (code *)0x10268a;
      pAVar10 = (ALLEGRO_BITMAP *)al_get_backbuffer(lVar9);
      pcStack_c0 = (code *)0x102692;
      set_perspective_transform(pAVar10);
      pcStack_c0 = (code *)0x10269a;
      uVar11 = al_get_backbuffer(lVar9);
      pcStack_c0 = (code *)0x1026b1;
      local_80 = (ALLEGRO_BITMAP *)al_create_sub_bitmap(uVar11,0,0,0x100,0x100);
      pcStack_c0 = (code *)0x1026be;
      set_perspective_transform(local_80);
      pcStack_c0 = (code *)0x1026c6;
      uVar11 = al_get_backbuffer(lVar9);
      pcStack_c0 = (code *)0x1026dd;
      local_88 = al_create_sub_bitmap(uVar11,0,0,0x100,0x200);
      pcStack_c0 = (code *)0x1026f1;
      local_90 = (ALLEGRO_BITMAP *)al_create_bitmap(200,200);
      pcStack_c0 = (code *)0x1026fe;
      set_perspective_transform(local_90);
      pcStack_c0 = (code *)0x10270b;
      uVar11 = al_create_timer(0x11111111);
      pcStack_c0 = (code *)0x102713;
      local_98 = al_create_builtin_font();
      pcStack_c0 = (code *)0x10271d;
      uVar12 = al_create_event_queue();
      pcStack_c0 = (code *)0x102725;
      uVar13 = al_get_keyboard_event_source();
      pcStack_c0 = (code *)0x102730;
      al_register_event_source(uVar12,uVar13);
      pcStack_c0 = (code *)0x102738;
      uVar13 = al_get_display_event_source(lVar9);
      pcStack_c0 = (code *)0x102743;
      al_register_event_source(uVar12,uVar13);
      pcStack_c0 = (code *)0x10274b;
      uVar13 = al_get_timer_event_source(uVar11);
      pcStack_c0 = (code *)0x102756;
      al_register_event_source(uVar12,uVar13);
      pcStack_c0 = (code *)0x102760;
      al_set_new_bitmap_flags(0x1c0);
      pcStack_c0 = (code *)0x10276c;
      local_a0 = (ALLEGRO_BITMAP *)al_load_bitmap("data/bkg.png");
      if (local_a0 != (ALLEGRO_BITMAP *)0x0) {
        pcStack_c0 = (code *)0x102787;
        local_b0 = uVar11;
        al_start_timer(uVar11);
        local_b8 = 0.0;
        local_b4 = 0;
        bVar17 = false;
        local_a8 = lVar9;
        bVar16 = false;
        bVar5 = false;
LAB_001027a4:
        bVar3 = bVar5;
        if (bVar17) {
          return 0;
        }
        pcStack_c0 = (code *)0x1027bb;
        al_wait_for_event(uVar12,&event);
        bVar17 = false;
        switch(event.type) {
        case 0x29:
          pcStack_c0 = (code *)0x1027e2;
          al_acknowledge_resize(lVar9);
LAB_00102898:
          pcStack_c0 = (code *)0x1028a0;
          pAVar10 = (ALLEGRO_BITMAP *)al_get_backbuffer(lVar9);
          pcStack_c0 = (code *)0x1028a8;
          set_perspective_transform(pAVar10);
          goto LAB_001028a8;
        case 0x2a:
switchD_001027d8_caseD_2a:
          bVar17 = true;
          break;
        case 0x2b:
        case 0x2c:
        case 0x2d:
        case 0x2e:
        case 0x2f:
          break;
        case 0x30:
          pcStack_c0 = (code *)0x102853;
          al_acknowledge_drawing_halt(lVar9);
          pcStack_c0 = (code *)0x10285d;
          al_stop_timer(local_b0);
          bVar16 = true;
          bVar17 = false;
          bVar5 = bVar3;
          goto LAB_001027a4;
        case 0x31:
          goto switchD_001027d8_caseD_31;
        default:
          if (event.type == 10) {
            if (event.display.width == 0x4b) {
              local_b4 = local_b4 ^ 1;
              pcStack_c0 = (code *)0x102898;
              al_set_display_flag(lVar9,0x200,local_b4 & 1);
              goto LAB_00102898;
            }
            if (event.display.width == 0x3b) goto switchD_001027d8_caseD_2a;
          }
          else {
            if (event.type != 0x1e) break;
            pcStack_c0 = (code *)0x10280f;
            dVar1 = fmod((double)local_b8 + 0.05,6.283185307179586);
            local_b8 = (float)dVar1;
            bVar3 = true;
          }
LAB_001028a8:
          bVar17 = false;
        }
        bVar2 = !bVar16;
        bVar16 = true;
        bVar5 = bVar3;
        if (bVar2) {
          if (bVar3) goto LAB_001028c2;
          goto LAB_00102a18;
        }
        goto LAB_001027a4;
      }
      pcVar15 = "Could not load data/bkg.png";
      local_a0 = (ALLEGRO_BITMAP *)0x0;
      lVar14 = lVar9;
    }
  }
  pcStack_c0 = set_perspective_transform;
  abort_example(pcVar15);
  pcStack_c0 = (code *)lVar14;
  iVar7 = al_get_bitmap_height();
  iVar8 = al_get_bitmap_width(pcVar15);
  al_set_target_bitmap(pcVar15);
  al_identity_transform(auStack_100);
  al_perspective_transform
            (0xbf800000,(float)iVar7 / (float)iVar8,0x3f800000,0x3f800000,
             -((float)iVar7 / (float)iVar8),0x447a0000,auStack_100);
  iVar7 = al_use_projection_transform(auStack_100);
  return iVar7;
switchD_001027d8_caseD_31:
  pcStack_c0 = (code *)0x102828;
  al_acknowledge_drawing_resume(lVar9);
  pcStack_c0 = (code *)0x102832;
  al_start_timer(local_b0);
  bVar17 = false;
  bVar16 = false;
  bVar5 = false;
  if (bVar3) {
LAB_001028c2:
    pcStack_c0 = (code *)0x1028ca;
    cVar6 = al_is_event_queue_empty(uVar12);
    if (cVar6 == '\0') {
      bVar16 = false;
      bVar5 = true;
    }
    else {
      pcStack_c0 = (code *)0x1028da;
      al_set_target_backbuffer(lVar9);
      pcStack_c0 = (code *)0x1028e9;
      al_set_render_state(0x12,1);
      fVar18 = 0.0;
      fVar19 = 0.0;
      pcStack_c0 = (code *)0x1028f7;
      al_map_rgb_f(0);
      pcStack_c0 = (code *)0x1028fc;
      al_clear_to_color();
      pcStack_c0 = (code *)0x102909;
      al_clear_depth_buffer(0x447a0000);
      pAVar10 = local_a0;
      pcStack_c0 = (code *)0x10291b;
      draw_pyramid(local_a0,local_b8,fVar18,fVar19,in_XMM3_Da);
      pAVar4 = local_90;
      pcStack_c0 = (code *)0x102928;
      al_set_target_bitmap(local_90);
      pcStack_c0 = (code *)0x102931;
      al_set_render_state(0x12,1);
      fVar18 = 0.1;
      fVar19 = 0.1;
      pcStack_c0 = (code *)0x102944;
      al_map_rgb_f(0);
      pcStack_c0 = (code *)0x102949;
      al_clear_to_color();
      pcStack_c0 = (code *)0x102956;
      al_clear_depth_buffer(0x447a0000);
      pcStack_c0 = (code *)0x102963;
      draw_pyramid(pAVar10,local_b8,fVar18,fVar19,in_XMM3_Da);
      pcStack_c0 = (code *)0x10296d;
      al_set_target_bitmap(local_80);
      pcStack_c0 = (code *)0x102976;
      al_set_render_state(0x12,1);
      fVar18 = 0.0;
      fVar19 = 0.25;
      pcStack_c0 = (code *)0x102989;
      al_map_rgb_f(0);
      pcStack_c0 = (code *)0x10298e;
      al_clear_to_color();
      pcStack_c0 = (code *)0x10299b;
      al_clear_depth_buffer(0x447a0000);
      pcStack_c0 = (code *)0x1029a8;
      draw_pyramid(pAVar10,local_b8,fVar18,fVar19,in_XMM3_Da);
      pcStack_c0 = (code *)0x1029b2;
      al_set_target_bitmap(local_88);
      pcStack_c0 = (code *)0x1029be;
      al_set_render_state(0x12,0);
      pcStack_c0 = (code *)0x1029d1;
      al_map_rgb_f(0x3f800000,0x3f800000,0x3f800000);
      lVar9 = local_a8;
      in_XMM3_Da = 16.0;
      pcStack_c0 = (code *)0x1029f9;
      al_draw_text(local_98,1,"Press Space to toggle fullscreen");
      pcStack_c0 = (code *)0x102a0e;
      al_draw_bitmap(0,pAVar4,0);
      pcStack_c0 = (code *)0x102a13;
      al_flip_display();
LAB_00102a18:
      bVar16 = false;
      bVar5 = false;
    }
  }
  goto LAB_001027a4;
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_DISPLAY *display;
   ALLEGRO_TIMER *timer;
   ALLEGRO_EVENT_QUEUE *queue;
   ALLEGRO_BITMAP *texture;
   ALLEGRO_BITMAP *display_sub_persp;
   ALLEGRO_BITMAP *display_sub_ortho;
   ALLEGRO_BITMAP *buffer;
   ALLEGRO_FONT *font;
   bool redraw = false;
   bool quit = false;
   bool fullscreen = false;
   bool background = false;
   int display_flags = ALLEGRO_RESIZABLE;
   float theta = 0;

   if (argc > 1) {
      if(strcmp(argv[1], "--use-shaders") == 0) {
         display_flags |= ALLEGRO_PROGRAMMABLE_PIPELINE;
      }
      else {
         abort_example("Unknown command line argument: %s\n", argv[1]);
      }
   }

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }
   al_init_image_addon();
   al_init_primitives_addon();
   al_init_font_addon();
   init_platform_specific();
   al_install_keyboard();

   al_set_new_display_flags(display_flags);
   al_set_new_display_option(ALLEGRO_DEPTH_SIZE, 16, ALLEGRO_SUGGEST);
   /* Load everything as a POT bitmap to make sure the projection stuff works
    * with mismatched backing texture and bitmap sizes. */
   al_set_new_display_option(ALLEGRO_SUPPORT_NPOT_BITMAP, 0, ALLEGRO_REQUIRE);
   display = al_create_display(800, 600);
   if (!display) {
      abort_example("Error creating display\n");
   }
   al_set_window_constraints(display, 256, 512, 0, 0);
   al_apply_window_constraints(display, true);
   set_perspective_transform(al_get_backbuffer(display));

   /* This bitmap is a sub-bitmap of the display, and has a perspective transformation. */
   display_sub_persp = al_create_sub_bitmap(al_get_backbuffer(display), 0, 0, 256, 256);
   set_perspective_transform(display_sub_persp);

   /* This bitmap is a sub-bitmap of the display, and has a orthographic transformation. */
   display_sub_ortho = al_create_sub_bitmap(al_get_backbuffer(display), 0, 0, 256, 512);

   /* This bitmap has a perspective transformation, purposefully non-POT */
   buffer = al_create_bitmap(200, 200);
   set_perspective_transform(buffer);

   timer = al_create_timer(1.0 / 60);
   font = al_create_builtin_font();

   queue = al_create_event_queue();
   al_register_event_source(queue, al_get_keyboard_event_source());
   al_register_event_source(queue, al_get_display_event_source(display));
   al_register_event_source(queue, al_get_timer_event_source(timer));

   al_set_new_bitmap_flags(ALLEGRO_MIN_LINEAR | ALLEGRO_MAG_LINEAR |
      ALLEGRO_MIPMAP);

   texture = al_load_bitmap("data/bkg.png");
   if (!texture) {
      abort_example("Could not load data/bkg.png");
   }

   al_start_timer(timer);
   while (!quit) {
      ALLEGRO_EVENT event;

      al_wait_for_event(queue, &event);
      switch (event.type) {
         case ALLEGRO_EVENT_DISPLAY_CLOSE:
            quit = true;
            break;
         case ALLEGRO_EVENT_DISPLAY_RESIZE:
            al_acknowledge_resize(display);
            set_perspective_transform(al_get_backbuffer(display));
            break;
         case ALLEGRO_EVENT_KEY_DOWN:
            switch (event.keyboard.keycode) {
               case ALLEGRO_KEY_ESCAPE:
                  quit = true;
                  break;
               case ALLEGRO_KEY_SPACE:
                  fullscreen = !fullscreen;
                  al_set_display_flag(display, ALLEGRO_FULLSCREEN_WINDOW, fullscreen);
                  set_perspective_transform(al_get_backbuffer(display));
                  break;
            }
            break;
         case ALLEGRO_EVENT_TIMER:
            redraw = true;
            theta = fmod(theta + 0.05, 2 * ALLEGRO_PI);
            break;
         case ALLEGRO_EVENT_DISPLAY_HALT_DRAWING:
            background = true;
            al_acknowledge_drawing_halt(display);
            al_stop_timer(timer);
            break;
         case ALLEGRO_EVENT_DISPLAY_RESUME_DRAWING:
            background = false;
            al_acknowledge_drawing_resume(display);
            al_start_timer(timer);
            break;
      }

      if (!background && redraw && al_is_event_queue_empty(queue)) {
         al_set_target_backbuffer(display);
         al_set_render_state(ALLEGRO_DEPTH_TEST, 1);
         al_clear_to_color(al_map_rgb_f(0, 0, 0));
         al_clear_depth_buffer(1000);
         draw_pyramid(texture, 0, 0, -4, theta);

         al_set_target_bitmap(buffer);
         al_set_render_state(ALLEGRO_DEPTH_TEST, 1);
         al_clear_to_color(al_map_rgb_f(0, 0.1, 0.1));
         al_clear_depth_buffer(1000);
         draw_pyramid(texture, 0, 0, -4, theta);

         al_set_target_bitmap(display_sub_persp);
         al_set_render_state(ALLEGRO_DEPTH_TEST, 1);
         al_clear_to_color(al_map_rgb_f(0, 0, 0.25));
         al_clear_depth_buffer(1000);
         draw_pyramid(texture, 0, 0, -4, theta);

         al_set_target_bitmap(display_sub_ortho);
         al_set_render_state(ALLEGRO_DEPTH_TEST, 0);
         al_draw_text(font, al_map_rgb_f(1, 1, 1), 128, 16, ALLEGRO_ALIGN_CENTER,
                      "Press Space to toggle fullscreen");
         al_draw_bitmap(buffer, 0, 256, 0);

         al_flip_display();
         redraw = false;
      }
   }
   return 0;
}